

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void VP8DspInitSSE2(void)

{
  VP8Transform = Transform_SSE2;
  VP8VFilter16 = VFilter16_SSE2;
  VP8HFilter16 = HFilter16_SSE2;
  VP8VFilter8 = VFilter8_SSE2;
  VP8HFilter8 = HFilter8_SSE2;
  VP8VFilter16i = VFilter16i_SSE2;
  VP8HFilter16i = HFilter16i_SSE2;
  VP8VFilter8i = VFilter8i_SSE2;
  VP8HFilter8i = HFilter8i_SSE2;
  VP8SimpleVFilter16 = SimpleVFilter16_SSE2;
  VP8SimpleHFilter16 = SimpleHFilter16_SSE2;
  VP8SimpleVFilter16i = SimpleVFilter16i_SSE2;
  VP8SimpleHFilter16i = SimpleHFilter16i_SSE2;
  VP8PredLuma4[1] = TM4_SSE2;
  VP8PredLuma4[2] = VE4_SSE2;
  VP8PredLuma4[4] = RD4_SSE2;
  VP8PredLuma4[5] = VR4_SSE2;
  VP8PredLuma4[6] = LD4_SSE2;
  VP8PredLuma4[7] = VL4_SSE2;
  VP8PredLuma16[0] = DC16_SSE2;
  VP8PredLuma16[1] = TM16_SSE2;
  VP8PredLuma16[2] = VE16_SSE2;
  VP8PredLuma16[3] = HE16_SSE2;
  VP8PredLuma16[4] = DC16NoTop_SSE2;
  VP8PredLuma16[5] = DC16NoLeft_SSE2;
  VP8PredLuma16[6] = DC16NoTopLeft_SSE2;
  VP8PredChroma8[0] = DC8uv_SSE2;
  VP8PredChroma8[1] = TM8uv_SSE2;
  VP8PredChroma8[2] = VE8uv_SSE2;
  VP8PredChroma8[4] = DC8uvNoTop_SSE2;
  VP8PredChroma8[5] = DC8uvNoLeft_SSE2;
  VP8PredChroma8[6] = DC8uvNoTopLeft_SSE2;
  return;
}

Assistant:

WEBP_TSAN_IGNORE_FUNCTION void VP8DspInitSSE2(void) {
  VP8Transform = Transform_SSE2;
#if (USE_TRANSFORM_AC3 == 1)
  VP8TransformAC3 = TransformAC3_SSE2;
#endif

  VP8VFilter16 = VFilter16_SSE2;
  VP8HFilter16 = HFilter16_SSE2;
  VP8VFilter8 = VFilter8_SSE2;
  VP8HFilter8 = HFilter8_SSE2;
  VP8VFilter16i = VFilter16i_SSE2;
  VP8HFilter16i = HFilter16i_SSE2;
  VP8VFilter8i = VFilter8i_SSE2;
  VP8HFilter8i = HFilter8i_SSE2;

  VP8SimpleVFilter16 = SimpleVFilter16_SSE2;
  VP8SimpleHFilter16 = SimpleHFilter16_SSE2;
  VP8SimpleVFilter16i = SimpleVFilter16i_SSE2;
  VP8SimpleHFilter16i = SimpleHFilter16i_SSE2;

  VP8PredLuma4[1] = TM4_SSE2;
  VP8PredLuma4[2] = VE4_SSE2;
  VP8PredLuma4[4] = RD4_SSE2;
  VP8PredLuma4[5] = VR4_SSE2;
  VP8PredLuma4[6] = LD4_SSE2;
  VP8PredLuma4[7] = VL4_SSE2;

  VP8PredLuma16[0] = DC16_SSE2;
  VP8PredLuma16[1] = TM16_SSE2;
  VP8PredLuma16[2] = VE16_SSE2;
  VP8PredLuma16[3] = HE16_SSE2;
  VP8PredLuma16[4] = DC16NoTop_SSE2;
  VP8PredLuma16[5] = DC16NoLeft_SSE2;
  VP8PredLuma16[6] = DC16NoTopLeft_SSE2;

  VP8PredChroma8[0] = DC8uv_SSE2;
  VP8PredChroma8[1] = TM8uv_SSE2;
  VP8PredChroma8[2] = VE8uv_SSE2;
  VP8PredChroma8[4] = DC8uvNoTop_SSE2;
  VP8PredChroma8[5] = DC8uvNoLeft_SSE2;
  VP8PredChroma8[6] = DC8uvNoTopLeft_SSE2;
}